

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_palette.c
# Opt level: O2

void prf_vertex_palette_entry_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode == prf_vertex_palette_info.opcode) {
    state->vertex_palette = node;
    state->model->vertex_palette = node;
    return;
  }
  prf_error(9,"tried vertex palette entry state method for node of type %d.");
  return;
}

Assistant:

static
void
prf_vertex_palette_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    assert( (state->vertex_palette == NULL) ||
            (state->vertex_palette == node) );

    if ( node->opcode != prf_vertex_palette_info.opcode ) {
        prf_error( 9,
            "tried vertex palette entry state method for node of type %d.",
            node->opcode );
        return;
    }

    state->vertex_palette = node;
    state->model->vertex_palette = node;
}